

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v6::internal::bigint::assign(bigint *this,bigint *other)

{
  size_t sVar1;
  
  buffer<unsigned_int>::resize
            ((buffer<unsigned_int> *)this,(other->bigits_).super_buffer<unsigned_int>.size_);
  sVar1 = (other->bigits_).super_buffer<unsigned_int>.size_;
  if (sVar1 != 0) {
    memmove((this->bigits_).super_buffer<unsigned_int>.ptr_,
            (other->bigits_).super_buffer<unsigned_int>.ptr_,sVar1 << 2);
  }
  this->exp_ = other->exp_;
  return;
}

Assistant:

void assign(const bigint& other) {
    bigits_.resize(other.bigits_.size());
    auto data = other.bigits_.data();
    std::copy(data, data + other.bigits_.size(), bigits_.data());
    exp_ = other.exp_;
  }